

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Connection_receiveChunksBlocking
          (UA_Connection *connection,UA_ByteString *chunks,UA_Boolean *realloced,UA_UInt32 timeout)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_DateTime UVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)timeout;
  UVar3 = UA_DateTime_nowMonotonic();
  lVar5 = uVar4 * 10000 + UVar3;
  *realloced = false;
  while( true ) {
    UVar1 = (*connection->recv)(connection,chunks,(UA_UInt32)uVar4);
    UVar2 = UA_Connection_completeMessages(connection,chunks,realloced);
    if ((UVar2 | UVar1) != 0) {
      return UVar2 | UVar1;
    }
    if (chunks->length != 0) break;
    UVar3 = UA_DateTime_nowMonotonic();
    if (lVar5 < UVar3) {
      return 0xaa0000;
    }
    uVar4 = (lVar5 - UVar3) / 10000;
  }
  return 0;
}

Assistant:

UA_StatusCode
UA_Connection_receiveChunksBlocking(UA_Connection *connection, UA_ByteString *chunks,
                                    UA_Boolean *realloced, UA_UInt32 timeout) {
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_DateTime maxDate = now + (timeout * UA_MSEC_TO_DATETIME);
    *realloced = false;

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    while(true) {
        /* Listen for messages to arrive */
        retval = connection->recv(connection, chunks, timeout);

        /* Get complete chunks and return */
        retval |= UA_Connection_completeMessages(connection, chunks, realloced);
        if(retval != UA_STATUSCODE_GOOD || chunks->length > 0)
            break;

        /* We received a message. But the chunk is incomplete. Compute the
         * remaining timeout. */
        now = UA_DateTime_nowMonotonic();
        if(now > maxDate)
            return UA_STATUSCODE_GOODNONCRITICALTIMEOUT;
        timeout = (UA_UInt32)((maxDate - now) / UA_MSEC_TO_DATETIME);
    }
    return retval;
}